

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot.h
# Opt level: O2

storage_range_t
calculateMedianRange<Result<unsigned_int,double>>
          (vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_> *rs,
          function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
          *valuesFunc,storage_t sizePercent)

{
  pointer pRVar1;
  vector<double,_std::allocator<double>_> *__x;
  ulong uVar2;
  ulong uVar3;
  pointer __args;
  double dVar4;
  double dVar5;
  double dVar6;
  storage_range_t sVar7;
  vector<double,_std::allocator<double>_> v;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  pRVar1 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  dVar4 = 1.79769313486232e+308;
  dVar6 = -1.79769313486232e+308;
  for (__args = (rs->
                super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __args != pRVar1; __args = __args + 1) {
    __x = std::
          function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
          ::operator()(valuesFunc,__args);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_38,__x);
    std::
    nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_38._M_impl.super__Vector_impl_data._M_start,
               (double *)
               (((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_38._M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffffffffff8U)
               + (long)local_38._M_impl.super__Vector_impl_data._M_start),
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_38._M_impl.super__Vector_impl_data._M_finish);
    uVar2 = (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3) >> 1;
    dVar5 = ((double)uVar2 * sizePercent) / 100.0;
    uVar3 = (ulong)dVar5;
    uVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    dVar5 = local_38._M_impl.super__Vector_impl_data._M_start[uVar2 - uVar3];
    if (dVar4 <= local_38._M_impl.super__Vector_impl_data._M_start[uVar2 - uVar3]) {
      dVar5 = dVar4;
    }
    dVar4 = dVar5;
    dVar5 = local_38._M_impl.super__Vector_impl_data._M_start[uVar2 + uVar3];
    if (local_38._M_impl.super__Vector_impl_data._M_start[uVar2 + uVar3] <= dVar6) {
      dVar5 = dVar6;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
    dVar6 = dVar5;
  }
  sVar7.second = dVar6;
  sVar7.first = dVar4;
  return sVar7;
}

Assistant:

typename ResultT::storage_range_t calculateMedianRange(const std::vector<ResultT>& rs, std::function<const std::vector<typename ResultT::storage_t>&(const ResultT&)> valuesFunc, typename ResultT::storage_t sizePercent)
{
    // calculate min / max percentage range of all values around median
    typename ResultT::storage_range_t rangeMinMax(std::numeric_limits<typename ResultT::storage_t>::max(), std::numeric_limits<typename ResultT::storage_t>::lowest());
    for (const auto& r : rs)
    {
        // calculate median of values
        std::vector<typename ResultT::storage_t> v = valuesFunc(r);
        std::nth_element(v.begin(), v.begin() + v.size() / 2, v.end());
        auto medianIt = v.cbegin() + v.size() / 2;
        // now get sizePercent values centered around median
        const decltype(v.size()) halfRange = v.size() / 2 * sizePercent / 100;
        auto leftIt = std::prev(medianIt, halfRange);
        auto rightIt = std::next(medianIt, halfRange);
        rangeMinMax.first = std::min(rangeMinMax.first, *leftIt);
        rangeMinMax.second = std::max(rangeMinMax.second, *rightIt);
    }
    return rangeMinMax;
}